

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

uint32_t find_min<float>(vector<float,_std::allocator<float>_> *arr)

{
  size_type sVar1;
  reference pvVar2;
  vector<float,_std::allocator<float>_> *in_RDI;
  uint32_t i;
  uint32_t argmin;
  float min_val;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 3.4028235e+38;
  local_10 = 0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    if (sVar1 <= local_14) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(ulong)local_14);
    if (*pvVar2 < local_c) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(ulong)local_14);
      local_c = *pvVar2;
      local_10 = local_14;
    }
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

uint32_t find_min(vector<T> arr)
{
	T min_val = FLT_MAX;
	uint32_t argmin = 0;

	for (uint32_t i = 0; i < arr.size(); i++)
	{
		if (arr[i] < min_val)
		{
			min_val = arr[i];
			argmin = i;
		}
	}
	return argmin;
}